

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

void Abc_TtCofactor0p(word *pOut,word *pIn,int nWords,int iVar)

{
  word *pwVar1;
  word wVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  
  bVar4 = (byte)iVar;
  if (nWords != 1) {
    if (iVar < 6) {
      uVar7 = 0;
      uVar8 = (ulong)(uint)nWords;
      if (nWords < 1) {
        uVar8 = uVar7;
      }
      for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
        pOut[uVar7] = (s_Truths6Neg[iVar] & pIn[uVar7]) << ((byte)(1 << (bVar4 & 0x1f)) & 0x3f) |
                      s_Truths6Neg[iVar] & pIn[uVar7];
      }
    }
    else {
      pwVar1 = pIn + nWords;
      uVar5 = 1 << (bVar4 - 6 & 0x1f);
      iVar6 = 2 << (bVar4 - 6 & 0x1f);
      uVar3 = 0;
      if (0 < (int)uVar5) {
        uVar3 = uVar5;
      }
      for (; pIn < pwVar1; pIn = pIn + iVar6) {
        for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
          wVar2 = pIn[uVar8];
          pOut[uVar8] = wVar2;
          pOut[(long)(int)uVar5 + uVar8] = wVar2;
        }
        pOut = pOut + iVar6;
      }
    }
    return;
  }
  *pOut = (s_Truths6Neg[iVar] & *pIn) << ((byte)(1 << (bVar4 & 0x1f)) & 0x3f) |
          s_Truths6Neg[iVar] & *pIn;
  return;
}

Assistant:

static inline void Abc_TtCofactor0p( word * pOut, word * pIn, int nWords, int iVar )
{
    if ( nWords == 1 )
        pOut[0] = ((pIn[0] & s_Truths6Neg[iVar]) << (1 << iVar)) | (pIn[0] & s_Truths6Neg[iVar]);
	else if ( iVar <= 5 )
	{
		int w, shift = (1 << iVar);
		for ( w = 0; w < nWords; w++ )
            pOut[w] = ((pIn[w] & s_Truths6Neg[iVar]) << shift) | (pIn[w] & s_Truths6Neg[iVar]);
	}
	else // if ( iVar > 5 )
	{
        word * pLimit = pIn + nWords;
		int i, iStep = Abc_TtWordNum(iVar);
		for ( ; pIn < pLimit; pIn += 2*iStep, pOut += 2*iStep )
			for ( i = 0; i < iStep; i++ )
            {
                pOut[i]         = pIn[i];
                pOut[i + iStep] = pIn[i];
            }
	}	
}